

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature.c
# Opt level: O3

int extractor(light_pcapng packet,void *data,size_t feature_count)

{
  byte bVar1;
  byte bVar2;
  ushort *puVar3;
  long lVar4;
  ushort uVar5;
  ulong uVar6;
  uint16_t source_port;
  long lVar7;
  long lVar8;
  char *__format;
  byte *pbVar9;
  long lVar10;
  uint32_t *body;
  uint32_t type;
  size_t body_size;
  ushort *local_50;
  undefined4 *local_48;
  int local_3c;
  size_t local_38;
  
  local_50 = (ushort *)0x0;
  local_38 = 0;
  local_3c = -0x21524111;
  light_get_block_info(packet,LIGHT_INFO_BODY,&local_50,&local_38);
  light_get_block_info(packet,LIGHT_INFO_TYPE,&local_3c,(size_t *)0x0);
  puVar3 = local_50;
  if (local_3c == 6) {
    local_48 = (undefined4 *)data;
    printf("HWaddr0: ");
    lVar10 = 0;
    do {
      printf("%x:",(ulong)*(byte *)((long)puVar3 + lVar10 + 0x14));
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != 6);
    putchar(10);
    printf("HWaddr1: ");
    lVar8 = -lVar10;
    lVar4 = 0;
    do {
      lVar7 = lVar4;
      printf("%x:",(ulong)*(byte *)((long)puVar3 + lVar10 + lVar7 + 0x14));
      lVar8 = lVar8 + -1;
      lVar4 = lVar7 + 1;
    } while ((int)(lVar7 + 1) != 6);
    putchar(10);
    uVar5 = *(ushort *)((long)puVar3 + lVar10 + lVar7 + 0x15);
    uVar5 = uVar5 << 8 | uVar5 >> 8;
    pbVar9 = (byte *)((long)puVar3 + (0x16 - lVar8));
    uVar6 = (ulong)uVar5;
    if (uVar5 < 0x86dd) {
      if (uVar5 != 0x800) {
        if (uVar5 != 0x8100) {
LAB_0010258f:
          __format = "Unhandled Ethernet type(len) 0x%X\n";
          goto LAB_001024ae;
        }
        pbVar9 = (byte *)((long)puVar3 + (0x1a - lVar8));
      }
    }
    else if (uVar5 == 0x9100) {
      pbVar9 = (byte *)((long)puVar3 + (0x1c - lVar8));
    }
    else if (uVar5 != 0x86dd) goto LAB_0010258f;
    bVar1 = *pbVar9;
    if (bVar1 >> 4 == 4) {
      bVar2 = pbVar9[9];
      printf("Packet total length = %u, protocol = %u\n",
             (ulong)(ushort)(*(ushort *)(pbVar9 + 2) << 8 | *(ushort *)(pbVar9 + 2) >> 8),
             (ulong)bVar2);
      printf("Source address: ");
      lVar10 = 0;
      do {
        printf("%u.",(ulong)pbVar9[lVar10 + 0xc]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      putchar(10);
      printf("Destination address: ");
      lVar10 = 0;
      do {
        printf("%u.",(ulong)pbVar9[lVar10 + 0x10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      putchar(10);
      if (bVar2 == 6) {
        uVar6 = (ulong)(byte)(bVar1 << 2);
        uVar5 = *(ushort *)(pbVar9 + uVar6) << 8 | *(ushort *)(pbVar9 + uVar6) >> 8;
        printf("TCP source: %u, destination: %u\n",(ulong)uVar5,
               (ulong)(ushort)(*(ushort *)(pbVar9 + uVar6 + 2) << 8 |
                              *(ushort *)(pbVar9 + uVar6 + 2) >> 8),(ulong)uVar5);
      }
      *local_48 = 0x3f800000;
    }
    else {
      printf("Protocol version = %u\n");
    }
    putchar(10);
  }
  else {
    if (local_3c != 1) {
      return 0;
    }
    printf("Interface link type = 0x%X\n",(ulong)*local_50);
    uVar6 = (ulong)*(uint *)(puVar3 + 2);
    __format = "Interface snapshot length = %u\n";
LAB_001024ae:
    printf(__format,uVar6);
  }
  return 0;
}

Assistant:

static int extractor(const light_pcapng packet, void *data, size_t feature_count)
{
	float *features = (float *)data;
	uint32_t *body = NULL;
	size_t body_size = 0;
	uint32_t type = LIGHT_UNKNOWN_DATA_BLOCK;
	uint8_t protocol_version;
	uint8_t ip_header_length;
	uint16_t ethernet_type;
	struct _light_enhanced_packet_block *epb;
	uint8_t *octets;
	int i;

	light_get_block_info(packet, LIGHT_INFO_BODY, &body, &body_size);
	light_get_block_info(packet, LIGHT_INFO_TYPE, &type, NULL);

	if (type == LIGHT_INTERFACE_BLOCK) {
		struct _light_interface_description_block *idb = (struct _light_interface_description_block *)body;
		print_interface(idb);
		return 0;
	}
	else if (type != LIGHT_ENHANCED_PACKET_BLOCK /*&& type != LIGHT_SIMPLE_PACKET_BLOCK*/) {
		return 0;
	}

	epb = (struct _light_enhanced_packet_block *)body;
	octets = (uint8_t *)epb->packet_data;

	printf("HWaddr0: "); // Print destination address.
	for (i = 0; i < 6; ++i) {
		uint8_t byte = *octets++;
		printf("%x:", byte);
	}
	printf("\n");

	printf("HWaddr1: "); // Print host address.
	for (i = 0; i < 6; ++i) {
		uint8_t byte = *octets++;
		printf("%x:", byte);
	}
	printf("\n");

	ethernet_type = ntohs(*(uint16_t*)(octets));
	octets += 2; // Skip rest of Ethernet header.

	switch (ethernet_type) {
	case 0x0800: // Internet Protocol v4
	case 0x86DD: // Internet Protocol v6
		break;
	case 0x8100: // 802.1Q Virtual LAN
		octets += 4;
		break;
	case 0x9100: // 802.1Q DoubleTag
		octets += 6;
		break;
	default:
		printf("Unhandled Ethernet type(len) 0x%X\n", ethernet_type);
		return 0;
	}

	ip_header_length = (*octets) & 0b1111;
	protocol_version = (*octets >> 4) & 0b1111;

	if (protocol_version == 4) {
		__handle_ipv4(octets, ip_header_length);
		features[FEATURE_PROTOCOL] = 1.0;
	}
	else {
		// TODO;
		printf("Protocol version = %u\n", protocol_version);
	}

	printf("\n");
	return 0;
}